

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O3

int dlep_reader_ipv6_conpoint_tlv
              (netaddr *addr,uint16_t *port,_Bool *tls,dlep_session *session,
              dlep_parser_value *value)

{
  uint8_t *puVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,3), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  if ((value->length | 2) != 0x13) {
    return -1;
  }
  puVar1 = (session->parser).tlv_ptr;
  uVar4 = (ulong)value->index;
  *tls = (_Bool)(puVar1[uVar4] & 1);
  uVar2 = 0x356;
  if (value->length == 0x13) {
    uVar2 = *(ushort *)(puVar1 + uVar4 + 0x11) << 8 | *(ushort *)(puVar1 + uVar4 + 0x11) >> 8;
  }
  *port = uVar2;
  iVar3 = netaddr_from_binary_prefix(addr,puVar1 + uVar4 + 1,0x10,'\n',0xff);
  return iVar3;
}

Assistant:

int
dlep_reader_ipv6_conpoint_tlv(
  struct netaddr *addr, uint16_t *port, bool *tls, struct dlep_session *session, struct dlep_parser_value *value) {
  uint16_t tmp;
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_IPV6_CONPOINT_TLV);
    if (!value) {
      return -1;
    }
  }

  if (value->length != 17 && value->length != 19) {
    return -1;
  }

  ptr = dlep_session_get_tlv_binary(session, value);

  /* handle TLS flag */
  *tls = (ptr[0] & DLEP_CONNECTION_TLS) == DLEP_CONNECTION_TLS;

  /* handle port */
  if (value->length == 19) {
    memcpy(&tmp, &ptr[17], sizeof(tmp));
    *port = ntohs(tmp);
  }
  else {
    *port = DLEP_PORT;
  }

  /* handle IP */
  return netaddr_from_binary(addr, &ptr[1], 16, AF_INET6);
}